

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HashTable.hpp
# Opt level: O2

HAItem_T<Qentem::String<char16_t>,_Qentem::Value<char16_t>_> * __thiscall
Qentem::
HashTable<Qentem::String<char16_t>,_Qentem::HAItem_T<Qentem::String<char16_t>,_Qentem::Value<char16_t>_>_>
::allocate(HashTable<Qentem::String<char16_t>,_Qentem::HAItem_T<Qentem::String<char16_t>,_Qentem::Value<char16_t>_>_>
           *this,SizeT new_capacity)

{
  uint uVar1;
  SizeT *pointer;
  uint uVar2;
  uint uVar3;
  
  uVar1 = (new_capacity & 1) + new_capacity;
  uVar2 = (uint)(byte)((byte)LZCOUNT(uVar1) ^ 0x1f);
  uVar3 = 1 << (uVar2 & 0x1f);
  uVar2 = 2 << (uVar2 & 0x1f);
  if (uVar1 <= uVar3) {
    uVar2 = uVar3;
  }
  this->capacity_ = uVar2;
  pointer = (SizeT *)operator_new((ulong)(uVar2 * 0x34));
  MemoryRecord::AddAllocation(pointer);
  this->hashTable_ = pointer;
  Memory::SetToZero<unsigned_int>(pointer,uVar2 << 2);
  return (HAItem_T<Qentem::String<char16_t>,_Qentem::Value<char16_t>_> *)(pointer + this->capacity_)
  ;
}

Assistant:

HItem *allocate(SizeT new_capacity) {
        constexpr SizeT32 size     = sizeof(SizeT);
        constexpr SizeT   size_sum = SizeT{size + sizeof(HItem)};

        // Making sure 'size' is not an odd number.
        new_capacity += (new_capacity & SizeT{1});
        new_capacity = Memory::AlignSize(new_capacity);

        setCapacity(new_capacity);

        SizeT *ht = Memory::ChangePointer<SizeT>(Memory::Allocate<char>((size_sum * new_capacity)));

        setHashTable(ht);

        Memory::SetToZero(ht, (size * new_capacity));

        return Memory::ChangePointer<HItem>(ht + Capacity());
    }